

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qendian.cpp
# Opt level: O3

void * qbswap<2>(void *source,qsizetype n,void *dest)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar2 = n * 2;
  if (uVar2 < 0x20) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      auVar7 = *(undefined1 (*) [16])((long)source + uVar5);
      auVar8 = *(undefined1 (*) [16])((long)source + uVar5 + 0x10);
      auVar9._0_2_ = auVar7._0_2_ >> 8;
      auVar9._2_2_ = auVar7._2_2_ >> 8;
      auVar9._4_2_ = auVar7._4_2_ >> 8;
      auVar9._6_2_ = auVar7._6_2_ >> 8;
      auVar9._8_2_ = auVar7._8_2_ >> 8;
      auVar9._10_2_ = auVar7._10_2_ >> 8;
      auVar9._12_2_ = auVar7._12_2_ >> 8;
      auVar9._14_2_ = auVar7._14_2_ >> 8;
      auVar7 = psllw(auVar7,8);
      auVar10._0_2_ = auVar8._0_2_ >> 8;
      auVar10._2_2_ = auVar8._2_2_ >> 8;
      auVar10._4_2_ = auVar8._4_2_ >> 8;
      auVar10._6_2_ = auVar8._6_2_ >> 8;
      auVar10._8_2_ = auVar8._8_2_ >> 8;
      auVar10._10_2_ = auVar8._10_2_ >> 8;
      auVar10._12_2_ = auVar8._12_2_ >> 8;
      auVar10._14_2_ = auVar8._14_2_ >> 8;
      auVar8 = psllw(auVar8,8);
      *(undefined1 (*) [16])((long)dest + uVar5) = auVar7 | auVar9;
      *(undefined1 (*) [16])((long)dest + uVar5 + 0x10) = auVar8 | auVar10;
      uVar4 = uVar5 + 0x20;
      uVar3 = uVar5 + 0x40;
      uVar5 = uVar4;
    } while (uVar3 <= uVar2);
  }
  if ((uVar4 | 0x10) <= uVar2) {
    auVar7 = *(undefined1 (*) [16])((long)source + uVar4);
    auVar8._0_2_ = auVar7._0_2_ >> 8;
    auVar8._2_2_ = auVar7._2_2_ >> 8;
    auVar8._4_2_ = auVar7._4_2_ >> 8;
    auVar8._6_2_ = auVar7._6_2_ >> 8;
    auVar8._8_2_ = auVar7._8_2_ >> 8;
    auVar8._10_2_ = auVar7._10_2_ >> 8;
    auVar8._12_2_ = auVar7._12_2_ >> 8;
    auVar8._14_2_ = auVar7._14_2_ >> 8;
    auVar7 = psllw(auVar7,8);
    *(undefined1 (*) [16])((long)dest + uVar4) = auVar7 | auVar8;
    uVar4 = uVar4 | 0x10;
  }
  if (uVar4 < uVar2) {
    uVar5 = 0;
    do {
      uVar1 = *(ushort *)((long)source + uVar5 + uVar4);
      *(ushort *)((long)dest + uVar5 + uVar4) = uVar1 << 8 | uVar1 >> 8;
      if (uVar2 <= uVar4 + 2 + uVar5) break;
      bVar6 = uVar5 < 0xe;
      uVar5 = uVar5 + 2;
    } while (bVar6);
  }
  return (void *)((long)dest + uVar2);
}

Assistant:

void *qbswap<2>(const void *source, qsizetype n, void *dest) noexcept
{
    const uchar *src = reinterpret_cast<const uchar *>(source);
    uchar *dst = reinterpret_cast<uchar *>(dest);

    return bswapLoop<quint16>(src, n << 1, dst);
}